

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertUnlinkableCommand
          (CommandRunner *this,AssertUnlinkableCommand *command)

{
  uint32_t line_number;
  string_view module_filename;
  Ref store;
  Enum EVar1;
  Ptr *in_R9;
  bool bVar2;
  Ptr module;
  Ptr trap;
  RefVec imports;
  Errors errors;
  Ptr instance;
  undefined8 local_50 [4];
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&module,this,module_filename,&errors);
  if (module.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line,
               "unable to compile unlinkable module: \"%s\"",(command->filename)._M_dataplus._M_p);
    EVar1 = Error;
  }
  else {
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&module,&imports);
    trap.obj_ = (Trap *)0x0;
    trap.store_ = (Store *)0x0;
    trap.root_index_ = 0;
    store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&module);
    wabt::interp::Instance::Instantiate
              (&instance,(Instance *)this,(Store *)store.index,(Ref)&imports,(RefVec *)&trap,in_R9);
    line_number = (command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line;
    bVar2 = trap.obj_ == (Trap *)0x0;
    if (bVar2) {
      PrintError(this,line_number,"expected module to be unlinkable: \"%s\"",
                 (command->filename)._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string((string *)local_50,(string *)&(trap.obj_)->message_);
      PrintError(this,line_number,"assert_unlinkable passed:\n  error: %s",local_50[0]);
      std::__cxx11::string::_M_dispose();
    }
    EVar1 = (Enum)bVar2;
    wabt::interp::RefPtr<wabt::interp::Instance>::reset(&instance);
    wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
    std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
              (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return (Result)EVar1;
}

Assistant:

wabt::Result CommandRunner::OnAssertUnlinkableCommand(
    const AssertUnlinkableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile unlinkable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be unlinkable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: Change to one-line error.
  PrintError(command->line, "assert_unlinkable passed:\n  error: %s",
             trap->message().c_str());
  return wabt::Result::Ok;
}